

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O1

void __thiscall
BoxNesting::KuhnAlgorithm::KuhnAlgorithm
          (KuhnAlgorithm *this,vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *boxes)

{
  vector<short,std::allocator<short>> *this_00;
  pointer pBVar1;
  iterator __position;
  pointer pvVar2;
  void *pvVar3;
  bool bVar4;
  short sVar5;
  long lVar6;
  allocator_type local_6b;
  ushort local_6a;
  vector<bool,_std::allocator<bool>_> local_68;
  vector<short,_std::allocator<short>_> *local_40;
  vector<short,_std::allocator<short>_> *local_38;
  
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  local_40 = &this->pairsRight;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = (short)((long)(boxes->
                        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(boxes->
                        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555;
  this->leftVerticesCount = sVar5;
  this->rightVerticesCount = sVar5;
  local_6a = 0xffff;
  local_38 = &this->pairsLeft;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_68,(long)sVar5,
             (value_type_conflict4 *)&local_6a,&local_6b);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->pairsLeft,&local_68);
  pvVar3 = (void *)CONCAT62(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._2_6_,
                            (short)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                           (long)pvVar3);
  }
  local_6a = 0xffff;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_68,(long)this->rightVerticesCount,
             (value_type_conflict4 *)&local_6a,&local_6b);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(local_40,&local_68);
  pvVar3 = (void *)CONCAT62(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._2_6_,
                            (short)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                           (long)pvVar3);
  }
  local_6a = local_6a & 0xff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_68,(long)this->leftVerticesCount,(bool *)&local_6a,(allocator_type *)&local_6b);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->used).super__Bvector_base<std::allocator<bool>_>);
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p =
       local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._12_4_,
                local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_offset);
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT62(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._2_6_,
                (short)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  *(ulong *)&(this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._12_4_,
                local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_offset);
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::resize(&this->graph,(long)this->leftVerticesCount);
  if (0 < this->leftVerticesCount) {
    lVar6 = 0;
    do {
      std::vector<short,_std::allocator<short>_>::reserve
                ((this->graph).
                 super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar6,(long)this->rightVerticesCount);
      local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_2_ = 0;
      if (0 < this->rightVerticesCount) {
        do {
          pBVar1 = (boxes->super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          bVar4 = Box::operator<(pBVar1 + lVar6,
                                 pBVar1 + (short)local_68.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p);
          if (bVar4) {
            this_00 = (vector<short,std::allocator<short>> *)
                      ((this->graph).
                       super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6);
            __position._M_current = *(short **)(this_00 + 8);
            if (__position._M_current == *(short **)(this_00 + 0x10)) {
              std::vector<short,std::allocator<short>>::_M_realloc_insert<short&>
                        (this_00,__position,(short *)&local_68);
            }
            else {
              *__position._M_current =
                   (short)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              *(short **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p._0_2_ =
               (short)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
        } while ((short)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p <
                 this->rightVerticesCount);
      }
      pvVar2 = (this->graph).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[lVar6].super__Vector_base<short,_std::allocator<short>_>._M_impl + 0x10)
          != *(pointer *)
              ((long)&pvVar2[lVar6].super__Vector_base<short,_std::allocator<short>_>._M_impl + 8))
      {
        std::__shrink_to_fit_aux<std::vector<short,_std::allocator<short>_>,_true>::_S_do_it
                  (pvVar2 + lVar6);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->leftVerticesCount);
  }
  return;
}

Assistant:

KuhnAlgorithm::KuhnAlgorithm(const std::vector<Box>& boxes)
{
	// In the boxes case left and right vertices are the same amount since
	// they are the amount of boxes
	this->leftVerticesCount = static_cast<int16_t>(boxes.size());
	this->rightVerticesCount = this->leftVerticesCount;

	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount, -1);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount, -1);
	this->used = std::vector<bool>(this->leftVerticesCount, false);

	this->graph.resize(this->leftVerticesCount);
	for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
		this->graph[i].reserve(this->rightVerticesCount);
		for (int16_t j = 0; j < this->rightVerticesCount; ++j) {
			if (boxes[i] < boxes[j]) {
				this->graph[i].emplace_back(j);
			}
		}
		this->graph[i].shrink_to_fit();
	}
}